

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::Vertex::Le(Vertex *this,vector<pbrt::Light,_std::allocator<pbrt::Light>_> *infiniteLights,
                Vertex *v,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  Vector3f d;
  Point3<float> p;
  Vector3f w_00;
  Vector3<float> v_00;
  Point3f p_00;
  array<float,_4> aVar2;
  bool bVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  float fVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  Point3f PVar18;
  Vector3<float> VVar19;
  SampledSpectrum SVar20;
  Light *light;
  const_iterator __end3;
  const_iterator __begin3;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *__range3;
  Vector3f w;
  SampledSpectrum Le;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_fffffffffffffda8;
  Ray *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar21;
  float in_stack_fffffffffffffdbc;
  undefined4 uVar22;
  Vertex *in_stack_fffffffffffffdc0;
  undefined4 local_238;
  float fVar23;
  undefined8 in_stack_fffffffffffffdd0;
  float in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  float in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffdfc;
  float in_stack_fffffffffffffe00;
  undefined1 local_198 [40];
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined1 local_150 [272];
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_40;
  float local_38;
  Tuple3<pbrt::Vector3,_float> local_20 [2];
  Float local_8;
  undefined4 uStack_4;
  undefined1 auVar5 [64];
  undefined1 auVar7 [64];
  undefined1 auVar17 [56];
  
  auVar14 = in_ZMM0._8_56_;
  local_238 = (undefined4)in_RDI;
  fVar23 = (float)((ulong)in_RDI >> 0x20);
  local_20[0]._0_8_ = in_RSI;
  bVar3 = IsLight(in_stack_fffffffffffffdc0);
  if (bVar3) {
    PVar18 = Vertex::p(in_stack_fffffffffffffdc0);
    local_150._248_4_ = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
    auVar5._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar5._8_56_ = auVar14;
    local_150._240_8_ = vmovlpd_avx(auVar5._0_16_);
    local_150._256_8_ = local_150._240_8_;
    local_150._264_4_ = local_150._248_4_;
    PVar18 = Vertex::p(in_stack_fffffffffffffdc0);
    local_150._200_4_ = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
    auVar6._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar14;
    local_150._192_8_ = vmovlpd_avx(auVar6._0_16_);
    auVar14 = ZEXT856(0);
    p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdd8;
    p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffdd0;
    p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
    local_150._208_8_ = local_150._192_8_;
    local_150._216_4_ = local_150._200_4_;
    local_150._224_8_ = local_150._192_8_;
    local_150._232_4_ = local_150._200_4_;
    VVar19 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),p);
    local_150._152_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar14;
    local_150._144_8_ = vmovlpd_avx(auVar7._0_16_);
    VVar19.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffffdc0;
    VVar19.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffdbc;
    local_150._160_8_ = local_150._144_8_;
    local_150._168_4_ = local_150._152_4_;
    local_150._176_8_ = local_150._144_8_;
    local_150._184_4_ = local_150._152_4_;
    local_40 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)local_150._144_8_;
    local_38 = (float)local_150._152_4_;
    fVar4 = LengthSquared<float>(VVar19);
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      local_150._128_4_ = local_38;
      local_150._120_8_ = local_40;
      local_150._112_4_ = local_38;
      local_150._104_8_ = local_40;
      auVar14 = ZEXT856(0);
      v_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffdfc;
      v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffdf8;
      v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe00;
      VVar19 = Normalize<float>(v_00);
      local_150._96_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar14;
      local_150._88_8_ = vmovlpd_avx(auVar8._0_16_);
      local_150._132_8_ = local_150._88_8_;
      local_150._140_4_ = local_150._96_4_;
      local_40 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)local_150._88_8_;
      local_38 = (float)local_150._96_4_;
      bVar3 = IsInfiniteLight(in_stack_fffffffffffffdc0);
      if (bVar3) {
        auVar9 = ZEXT1664((undefined1  [16])0x0);
        SampledSpectrum::SampledSpectrum
                  ((SampledSpectrum *)in_stack_fffffffffffffdb0,
                   (Float)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        local_150._80_4_ = local_20[0].x;
        local_150._84_4_ = local_20[0].y;
        local_150._72_8_ =
             std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::begin
                       (in_stack_fffffffffffffda8);
        local_150._64_8_ =
             std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::end(in_stack_fffffffffffffda8);
        while( true ) {
          auVar14 = auVar9._8_56_;
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_pbrt::Light_*,_std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>_>
                              *)in_stack_fffffffffffffdb0,
                             (__normal_iterator<const_pbrt::Light_*,_std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>_>
                              *)in_stack_fffffffffffffda8);
          if (!bVar3) break;
          local_150._56_8_ =
               __gnu_cxx::
               __normal_iterator<const_pbrt::Light_*,_std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>_>
               ::operator*((__normal_iterator<const_pbrt::Light_*,_std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>_>
                            *)(local_150 + 0x48));
          uVar21 = (undefined4)local_150._56_8_;
          uVar22 = (undefined4)((ulong)local_150._56_8_ >> 0x20);
          PVar18 = Vertex::p(in_stack_fffffffffffffdc0);
          local_168 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
          auVar10._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar10._8_56_ = auVar14;
          local_170 = vmovlpd_avx(auVar10._0_16_);
          local_160 = local_170;
          local_158 = local_168;
          VVar19 = Tuple3<pbrt::Vector3,_float>::operator-
                             ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffdb0);
          local_198._16_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar11._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar11._8_56_ = auVar14;
          local_198._8_8_ = vmovlpd_avx(auVar11._0_16_);
          in_stack_fffffffffffffdb0 = (Ray *)local_198;
          local_198._24_8_ = local_198._8_8_;
          local_198._32_4_ = local_198._16_4_;
          Medium::TaggedPointer((Medium *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
          auVar14 = (undefined1  [56])0x0;
          auVar17 = (undefined1  [56])0x0;
          in_stack_fffffffffffffdc0 = (Vertex *)local_150;
          PVar18.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffdec;
          PVar18.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffde8;
          PVar18.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdf0;
          d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffdd0;
          d.super_Tuple3<pbrt::Vector3,_float>.z =
               (float)(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
          d.super_Tuple3<pbrt::Vector3,_float>.x = fVar23;
          Ray::Ray(in_stack_fffffffffffffdb0,PVar18,d,
                   (Float)((ulong)in_stack_fffffffffffffda8 >> 0x20),(Medium *)0x82ea63);
          SVar20 = Light::Le((Light *)in_stack_fffffffffffffdc0,(Ray *)CONCAT44(uVar22,uVar21),
                             (SampledWavelengths *)in_stack_fffffffffffffdb0);
          auVar15._0_8_ = SVar20.values.values._8_8_;
          auVar15._8_56_ = auVar17;
          auVar9._0_8_ = SVar20.values.values._0_8_;
          auVar9._8_56_ = auVar14;
          local_150._40_8_ = vmovlpd_avx(auVar9._0_16_);
          local_150._48_8_ = vmovlpd_avx(auVar15._0_16_);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffffdc0,
                     (SampledSpectrum *)CONCAT44(uVar22,uVar21));
          __gnu_cxx::
          __normal_iterator<const_pbrt::Light_*,_std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>_>
          ::operator++((__normal_iterator<const_pbrt::Light_*,_std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>_>
                        *)(local_150 + 0x48));
        }
      }
      else {
        bVar3 = pbrt::TaggedPointer::operator_cast_to_bool
                          ((TaggedPointer *)(CONCAT44(fVar23,local_238) + 0xe0));
        if (bVar3) {
          PVar18 = Interaction::p((Interaction *)
                                  CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          auVar12._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar12._8_56_ = auVar14;
          uVar1 = vmovlpd_avx(auVar12._0_16_);
          auVar14 = ZEXT856(0);
          auVar17 = (undefined1  [56])0x0;
          p_00.super_Tuple3<pbrt::Point3,_float>.z = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
          p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
          p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
          w_00.super_Tuple3<pbrt::Vector3,_float>.y = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
          w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar1 >> 0x20);
          w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffdfc;
          SVar20 = Light::L((Light *)CONCAT44(in_stack_fffffffffffffddc,local_38),p_00,
                            (Normal3f)
                            *(Tuple3<pbrt::Normal3,_float> *)(CONCAT44(fVar23,local_238) + 0x40),
                            (Point2f)local_40,w_00,(SampledWavelengths *)local_40);
          auVar16._0_8_ = SVar20.values.values._8_8_;
          auVar16._8_56_ = auVar17;
          auVar13._0_8_ = SVar20.values.values._0_8_;
          auVar13._8_56_ = auVar14;
          local_20[1]._4_8_ = vmovlpd_avx(auVar13._0_16_);
          _local_8 = vmovlpd_avx(auVar16._0_16_);
        }
        else {
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)in_stack_fffffffffffffdb0,
                     (Float)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        }
      }
    }
    else {
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)in_stack_fffffffffffffdb0,
                 (Float)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    }
  }
  else {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)in_stack_fffffffffffffdb0,
               (Float)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  }
  aVar2.values[2] = local_8;
  aVar2.values[3] = (float)uStack_4;
  aVar2.values[0] = local_20[1].y;
  aVar2.values[1] = local_20[1].z;
  return (array<float,_4>)(array<float,_4>)aVar2.values;
}

Assistant:

SampledSpectrum Le(const std::vector<Light> &infiniteLights, const Vertex &v,
                       const SampledWavelengths &lambda) const {
        if (!IsLight())
            return SampledSpectrum(0.f);
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return SampledSpectrum(0.);
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return emitted radiance for infinite light sources
            SampledSpectrum Le(0.f);
            for (const auto &light : infiniteLights)
                Le += light.Le(Ray(p(), -w), lambda);
            return Le;

        } else if (si.areaLight)
            return si.areaLight.L(si.p(), si.n, si.uv, w, lambda);
        else
            return SampledSpectrum(0.f);
    }